

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall am_CList::Validate(am_CList *this,Am_Slot *validating_slot)

{
  CItem *pCVar1;
  int iVar2;
  bool changed;
  Am_Value value;
  char local_31;
  Am_Value local_30;
  
  local_30.type = 0;
  local_30.value.wrapper_value = (Am_Wrapper *)0x0;
  while (pCVar1 = this->head, pCVar1 != (CItem *)0x0) {
    this->head = (CItem *)pCVar1->field_1;
    (pCVar1->field_1).prev = (CItem *)0x0;
    local_31 = '\0';
    iVar2 = (*(pCVar1->value->super_Am_Registered_Type)._vptr_Am_Registered_Type[5])
                      (pCVar1->value,validating_slot,&local_30,&local_31);
    if (((char)iVar2 != '\0') && (local_31 == '\x01')) {
      local_30.type = 0x1002;
    }
  }
  Am_Value::~Am_Value(&local_30);
  return;
}

Assistant:

void
am_CList::Validate(const Am_Slot &validating_slot)
{
  CItem *curr;
  Am_Value value;
  while (head) {
    curr = head;
    head = head->next_invalid;
    curr->next_invalid = nullptr;
    bool changed = false;
    if (curr->value->Get(validating_slot, value, changed) && changed)
      value.type = Am_MISSING_SLOT;
  }
}